

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadowValue.cpp
# Opt level: O0

string * __thiscall ShadowValue::getCSVformat_abi_cxx11_(ShadowValue *this)

{
  int iVar1;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__val;
  char *extraout_XMM0_Qa;
  char *in_stack_fffffffffffffd70;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdbc;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [48];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffda8);
  std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::__cxx11::to_string((double)in_stack_fffffffffffffd78);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::__cxx11::to_string((double)in_stack_fffffffffffffd78);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::__cxx11::to_string((double)in_stack_fffffffffffffd78);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  iVar1 = (int)local_b0;
  std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::abs(iVar1);
  __lhs = __val;
  std::__cxx11::to_string((double)__val);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  iVar1 = (int)local_70;
  std::operator+(__lhs,in_stack_fffffffffffffd70);
  std::abs(iVar1);
  __rhs = extraout_XMM0_Qa;
  std::__cxx11::to_string((double)__lhs);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::operator+(__lhs,__rhs);
  std::__cxx11::to_string(in_stack_fffffffffffffdbc);
  std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  return in_RDI;
}

Assistant:

string ShadowValue::getCSVformat(){
    return to_string(__index) + " "
#ifdef USE_TIMESTAMP
        + to_string(__timeStamp) + " "
#endif
        + to_string(__argument) + " "
        + to_string(__doubleP) + " "
        + to_string(__singleP) + " "
        + to_string(abs(__doubleP - __singleP)) + " "
        + to_string(abs(__doubleP - __singleP)/__doubleP) + " "
        + to_string(__spBoolean);
}